

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O3

int ovf_read_segment_header(ovf_file *ovf_file_ptr,int index,ovf_segment *segment)

{
  parser_state *ppVar1;
  int iVar2;
  ulong *puVar3;
  string *psVar4;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  ulong *local_298 [2];
  ulong local_288 [2];
  ulong *local_278 [2];
  ulong local_268 [2];
  char *local_258;
  undefined **local_240;
  undefined1 *local_238;
  long local_230;
  undefined8 local_228;
  undefined1 local_220 [504];
  
  psVar4 = (string *)local_298;
  if (ovf_file_ptr == (ovf_file *)0x0) {
    return -2;
  }
  if (segment == (ovf_segment *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)&ovf_file_ptr->_state->message_latest,0,
               (char *)(ovf_file_ptr->_state->message_latest)._M_string_length,0x156c44);
    return -2;
  }
  if (ovf_file_ptr->found == false) {
    local_298[0] = (ulong *)ovf_file_ptr->file_name;
    local_238 = local_220;
    local_230 = 0;
    local_240 = &PTR_grow_00178c20;
    local_228 = 500;
    format_str.size_ = 0x3b;
    format_str.data_ = "libovf ovf_read_segment_header: file \'{}\' does not exist...";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_298;
    args.types_ = fmt::v5::
                  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
                  ::TYPES;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_240,format_str,args);
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,local_238,local_238 + local_230);
  }
  else {
    if (ovf_file_ptr->is_ovf != false) {
      if (index < 0) {
        local_278[0] = (ulong *)(ulong)(uint)index;
        local_268[0] = (ulong)(uint)ovf_file_ptr->n_segments;
        local_258 = ovf_file_ptr->file_name;
        local_238 = local_220;
        local_230 = 0;
        local_240 = &PTR_grow_00178c20;
        local_228 = 500;
        format_str_01.size_ = 0x39;
        format_str_01.data_ = "libovf ovf_read_segment_header: invalid index ({}) < 0...";
        args_01.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)local_278;
        args_01.types_ =
             fmt::v5::
             format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int,char_const*>
             ::TYPES;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_240,format_str_01,args_01);
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,local_238,local_238 + local_230);
      }
      else {
        local_268[0] = (ulong)(uint)ovf_file_ptr->n_segments;
        if (index < ovf_file_ptr->n_segments) {
          iVar2 = ovf::detail::parse::segment_header(ovf_file_ptr,index,segment);
          if (iVar2 != -1) {
            std::__cxx11::string::append((char *)&ovf_file_ptr->_state->message_latest);
            return iVar2;
          }
          return -1;
        }
        local_278[0] = (ulong *)(ulong)(uint)index;
        local_258 = ovf_file_ptr->file_name;
        local_238 = local_220;
        local_230 = 0;
        local_240 = &PTR_grow_00178c20;
        local_228 = 500;
        format_str_02.size_ = 0x4d;
        format_str_02.data_ =
             "libovf ovf_read_segment_header: index ({}) >= n_segments ({}) of file \'{}\'...";
        args_02.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)local_278;
        args_02.types_ =
             fmt::v5::
             format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int,char_const*>
             ::TYPES;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_240,format_str_02,args_02);
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,local_238,local_238 + local_230);
      }
      puVar3 = local_288;
      local_240 = &PTR_grow_00178c20;
      if (local_238 != local_220) {
        operator_delete(local_238);
      }
      ppVar1 = ovf_file_ptr->_state;
      goto LAB_00135157;
    }
    local_298[0] = (ulong *)ovf_file_ptr->file_name;
    local_238 = local_220;
    local_230 = 0;
    local_240 = &PTR_grow_00178c20;
    local_228 = 500;
    format_str_00.size_ = 0x37;
    format_str_00.data_ = "libovf ovf_read_segment_header: file \'{}\' is not ovf...";
    args_00.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_298;
    args_00.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
         ::TYPES;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_240,format_str_00,args_00);
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,local_238,local_238 + local_230);
  }
  puVar3 = local_268;
  local_240 = &PTR_grow_00178c20;
  if (local_238 != local_220) {
    operator_delete(local_238);
  }
  ppVar1 = ovf_file_ptr->_state;
  psVar4 = (string *)local_278;
LAB_00135157:
  std::__cxx11::string::operator=((string *)&ppVar1->message_latest,psVar4);
  if (*(ulong **)psVar4 != puVar3) {
    operator_delete(*(ulong **)psVar4);
  }
  return -2;
}

Assistant:

int ovf_read_segment_header(struct ovf_file * ovf_file_ptr, int index, struct ovf_segment *segment)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;

    if( !segment )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_read_segment_header: invalid segment pointer";
        return OVF_ERROR;
    }

    if( !ovf_file_ptr->found )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: file \'{}\' does not exist...",
            ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( !ovf_file_ptr->is_ovf )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: file \'{}\' is not ovf...",
            ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( index < 0 )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: invalid index ({}) < 0...",
            index, ovf_file_ptr->n_segments, ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( index >= ovf_file_ptr->n_segments )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: index ({}) >= n_segments ({}) of file \'{}\'...",
            index, ovf_file_ptr->n_segments, ovf_file_ptr->file_name);
        return OVF_ERROR;
    }
    int retcode = ovf::detail::parse::segment_header( *ovf_file_ptr, index, *segment );
    if (retcode != OVF_OK)
        ovf_file_ptr->_state->message_latest += "\novf_read_segment_header failed.";
    return retcode;
}
catch( ... )
{
    return OVF_ERROR;
}